

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O0

SPxId __thiscall soplex::SPxSteepPR<double>::selectEnter(SPxSteepPR<double> *this)

{
  long *plVar1;
  bool bVar2;
  Verbosity VVar3;
  DataKey rhs;
  UpdateVector<double> *this_00;
  SPxBasisBase<double> *rhs_00;
  SSVectorBase<double> *in_RDI;
  double dVar4;
  double in_stack_00000010;
  SSVectorBase<double> *delta;
  Verbosity old_verbosity;
  SPxId enterId;
  char *in_stack_ffffffffffffffb8;
  SPxOut *in_stack_ffffffffffffffc0;
  SPxBasisBase<double> *this_01;
  DataKey in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  Verbosity in_stack_ffffffffffffffe4;
  SSVectorBase<double> *this_02;
  DataKey local_8;
  
  this_02 = in_RDI;
  SPxId::SPxId((SPxId *)0x2e4f1d);
  rhs = (DataKey)selectEnterX((SPxSteepPR<double> *)delta,in_stack_00000010);
  local_8 = rhs;
  bVar2 = SPxId::isValid((SPxId *)&local_8);
  if ((!bVar2) && (((ulong)in_RDI[4].super_IdxSet.idx & 0x100000000) == 0)) {
    *(undefined1 *)((long)&in_RDI[4].super_IdxSet.idx + 4) = 1;
    if ((*(long *)((in_RDI->super_IdxSet).idx + 0x246) != 0) &&
       (VVar3 = SPxOut::getVerbosity(*(SPxOut **)((in_RDI->super_IdxSet).idx + 0x246)),
       4 < (int)VVar3)) {
      in_stack_ffffffffffffffe4 =
           SPxOut::getVerbosity(*(SPxOut **)((in_RDI->super_IdxSet).idx + 0x246));
      plVar1 = *(long **)((in_RDI->super_IdxSet).idx + 0x246);
      in_stack_ffffffffffffffe0 = 5;
      (**(code **)(*plVar1 + 0x10))(plVar1,&stack0xffffffffffffffe0);
      soplex::operator<<(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      plVar1 = *(long **)((in_RDI->super_IdxSet).idx + 0x246);
      (**(code **)(*plVar1 + 0x10))(plVar1,&stack0xffffffffffffffe4);
    }
    in_stack_ffffffffffffffd8 = (DataKey)selectEnterX((SPxSteepPR<double> *)delta,in_stack_00000010)
    ;
    local_8 = in_stack_ffffffffffffffd8;
  }
  bVar2 = SPxId::isValid((SPxId *)&local_8);
  if (bVar2) {
    this_00 = SPxSolverBase<double>::fVec((SPxSolverBase<double> *)(in_RDI->super_IdxSet).idx);
    rhs_00 = (SPxBasisBase<double> *)UpdateVector<double>::delta(this_00);
    SPxSolverBase<double>::basis((SPxSolverBase<double> *)(in_RDI->super_IdxSet).idx);
    this_01 = rhs_00;
    SPxSolverBase<double>::vector
              ((SPxSolverBase<double> *)
               CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               (SPxId *)in_stack_ffffffffffffffd8);
    SPxBasisBase<double>::solve4update(this_01,in_RDI,(SVectorBase<double> *)rhs_00);
    SSVectorBase<double>::setup_and_assign<double>(this_02,(SSVectorBase<double> *)rhs);
    dVar4 = SSVectorBase<double>::length2((SSVectorBase<double> *)this_01);
    *(double *)&in_RDI[4].super_IdxSet.num = dVar4 + 1.0;
    SPxSolverBase<double>::setup4coSolve
              ((SPxSolverBase<double> *)(in_RDI->super_IdxSet).idx,
               (SSVectorBase<double> *)&in_RDI->setupStatus,
               (SSVectorBase<double> *)&in_RDI[1].setupStatus);
  }
  return (SPxId)local_8;
}

Assistant:

SPxId SPxSteepPR<R>::selectEnter()
{
   assert(this->thesolver != nullptr);
   SPxId enterId;

   enterId = selectEnterX(this->thetolerance);

   if(!enterId.isValid() && !refined)
   {
      refined = true;
      SPX_MSG_INFO3((*this->thesolver->spxout),
                    (*this->thesolver->spxout) << "WSTEEP05 trying refinement step..\n";)
      enterId = selectEnterX(this->thetolerance / SOPLEX_STEEP_REFINETOL);
   }

   assert(isConsistent());

   if(enterId.isValid())
   {
      SSVectorBase<R>& delta = this->thesolver->fVec().delta();

      this->thesolver->basis().solve4update(delta, this->thesolver->vector(enterId));

      workRhs.setup_and_assign(delta);
      pi_p = 1 + delta.length2();

      this->thesolver->setup4coSolve(&workVec, &workRhs);
   }

   return enterId;
}